

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# arkode.c
# Opt level: O0

ARKodeMem arkCreate(SUNContext_conflict sunctx)

{
  int iVar1;
  ARKodeHAdaptMem pAVar2;
  SUNContext_conflict in_RDI;
  ARKodeMem ark_mem;
  int iret;
  undefined4 in_stack_ffffffffffffffe8;
  undefined4 in_stack_ffffffffffffffec;
  ARKodeMem local_8;
  
  if (in_RDI == (SUNContext_conflict)0x0) {
    arkProcessError((ARKodeMem)0x0,-0x16,0x5d0,"arkCreate",
                    "/workspace/llm4binary/github/license_c_cmakelists/LLNL[P]sundials/src/arkode/arkode.c"
                    ,"sunctx = NULL illegal.");
    local_8 = (ARKodeMem)0x0;
  }
  else {
    local_8 = (ARKodeMem)malloc(0x440);
    if (local_8 == (ARKodeMem)0x0) {
      arkProcessError((ARKodeMem)0x0,-0x14,0x5d9,"arkCreate",
                      "/workspace/llm4binary/github/license_c_cmakelists/LLNL[P]sundials/src/arkode/arkode.c"
                      ,"Allocation of arkode_mem failed.");
      local_8 = (ARKodeMem)0x0;
    }
    else {
      memset(local_8,0,0x440);
      local_8->sunctx = in_RDI;
      local_8->uround = 2.220446049250313e-16;
      local_8->step_attachlinsol = (ARKTimestepAttachLinsolFn)0x0;
      local_8->step_attachmasssol = (ARKTimestepAttachMasssolFn)0x0;
      local_8->step_disablelsetup = (ARKTimestepDisableLSetup)0x0;
      local_8->step_disablemsetup = (ARKTimestepDisableMSetup)0x0;
      local_8->step_getlinmem = (ARKTimestepGetLinMemFn)0x0;
      local_8->step_getmassmem = (ARKTimestepGetMassMemFn)0x0;
      local_8->step_getimplicitrhs = (ARKTimestepGetImplicitRHSFn)0x0;
      local_8->step_mmult = (ARKMassMultFn)0x0;
      local_8->step_getgammas = (ARKTimestepGetGammasFn)0x0;
      local_8->step_init = (ARKTimestepInitFn)0x0;
      local_8->step_fullrhs = (ARKTimestepFullRHSFn)0x0;
      local_8->step = (ARKTimestepStepFn)0x0;
      local_8->step_setuserdata = (ARKTimetepSetUserDataFn)0x0;
      local_8->step_printallstats = (ARKTimestepPrintAllStats)0x0;
      local_8->step_writeparameters = (ARKTimestepWriteParameters)0x0;
      local_8->step_resize = (ARKTimestepResize)0x0;
      local_8->step_reset = (ARKTimestepReset)0x0;
      local_8->step_free = (ARKTimestepFree)0x0;
      local_8->step_printmem = (ARKTimestepPrintMem)0x0;
      local_8->step_setdefaults = (ARKTimestepSetDefaults)0x0;
      local_8->step_computestate = (ARKTimestepComputeState)0x0;
      local_8->step_setrelaxfn = (ARKTimestepSetRelaxFn)0x0;
      local_8->step_setorder = (ARKTimestepSetOrder)0x0;
      local_8->step_setnonlinearsolver = (ARKTimestepSetNonlinearSolver)0x0;
      local_8->step_setlinear = (ARKTimestepSetLinear)0x0;
      local_8->step_setnonlinear = (ARKTimestepSetNonlinear)0x0;
      local_8->step_setautonomous = (ARKTimestepSetAutonomous)0x0;
      local_8->step_setnlsrhsfn = (ARKTimestepSetNlsRhsFn)0x0;
      local_8->step_setdeduceimplicitrhs = (ARKTimestepSetDeduceImplicitRhs)0x0;
      local_8->step_setnonlincrdown = (ARKTimestepSetNonlinCRDown)0x0;
      local_8->step_setnonlinrdiv = (ARKTimestepSetNonlinRDiv)0x0;
      local_8->step_setdeltagammamax = (ARKTimestepSetDeltaGammaMax)0x0;
      local_8->step_setlsetupfrequency = (ARKTimestepSetLSetupFrequency)0x0;
      local_8->step_setpredictormethod = (ARKTimestepSetPredictorMethod)0x0;
      local_8->step_setmaxnonliniters = (ARKTimestepSetMaxNonlinIters)0x0;
      local_8->step_setnonlinconvcoef = (ARKTimestepSetNonlinConvCoef)0x0;
      local_8->step_setstagepredictfn = (ARKTimestepSetStagePredictFn)0x0;
      local_8->step_getnumrhsevals = (ARKTimestepGetNumRhsEvals)0x0;
      local_8->step_setstepdirection = (ARKTimestepSetStepDirection)0x0;
      local_8->step_getnumlinsolvsetups = (ARKTimestepGetNumLinSolvSetups)0x0;
      local_8->step_setadaptcontroller = (ARKSetAdaptControllerFn)0x0;
      local_8->step_getestlocalerrors = (ARKTimestepGetEstLocalErrors)0x0;
      local_8->step_getcurrentgamma = (ARKTimestepGetCurrentGamma)0x0;
      local_8->step_getnonlinearsystemdata = (ARKTimestepGetNonlinearSystemData)0x0;
      local_8->step_getnumnonlinsolviters = (ARKTimestepGetNumNonlinSolvIters)0x0;
      local_8->step_getnumnonlinsolvconvfails = (ARKTimestepGetNumNonlinSolvConvFails)0x0;
      local_8->step_getnonlinsolvstats = (ARKTimestepGetNonlinSolvStats)0x0;
      local_8->step_setforcing = (ARKTimestepSetForcingFn)0x0;
      local_8->step_mem = (void *)0x0;
      local_8->step_supports_adaptive = 0;
      local_8->step_supports_implicit = 0;
      local_8->step_supports_massmatrix = 0;
      local_8->step_supports_relaxation = 0;
      local_8->root_mem = (ARKodeRootMem)0x0;
      local_8->constraintsSet = 0;
      local_8->constraints = (N_Vector)0x0;
      local_8->relax_enabled = 0;
      local_8->relax_mem = (ARKodeRelaxMem)0x0;
      local_8->lrw = 0x12;
      local_8->liw = 0x35;
      local_8->VabstolMallocDone = 0;
      local_8->VRabstolMallocDone = 0;
      local_8->MallocDone = 0;
      local_8->ProcessStep = (ARKPostProcessFn)0x0;
      local_8->ps_data = (void *)0x0;
      local_8->ProcessStage = (ARKPostProcessFn)0x0;
      local_8->user_data = (void *)0x0;
      pAVar2 = arkAdaptInit();
      local_8->hadapt_mem = pAVar2;
      if (local_8->hadapt_mem == (ARKodeHAdaptMem)0x0) {
        arkProcessError((ARKodeMem)0x0,-0x14,0x640,"arkCreate",
                        "/workspace/llm4binary/github/license_c_cmakelists/LLNL[P]sundials/src/arkode/arkode.c"
                        ,"Allocation of step adaptivity structure failed");
        ARKodeFree(&local_8->sunctx);
        local_8 = (ARKodeMem)0x0;
      }
      else {
        local_8->lrw = local_8->lrw + 10;
        local_8->liw = local_8->liw + 7;
        local_8->interp = (ARKInterp)0x0;
        local_8->interp_type = 0;
        local_8->interp_degree = 5;
        local_8->rwt_is_ewt = 1;
        local_8->call_fullrhs = 0;
        local_8->initsetup = 1;
        local_8->init_type = 0;
        local_8->firststage = 1;
        local_8->initialized = 0;
        local_8->h = 0.0;
        local_8->h0u = 0.0;
        local_8->AccumErrorType = ARK_ACCUMERROR_NONE;
        local_8->AccumError = 0.0;
        iVar1 = ARKodeSetDefaults((void *)CONCAT44(in_stack_ffffffffffffffec,
                                                   in_stack_ffffffffffffffe8));
        if (iVar1 == 0) {
          local_8->load_checkpoint_fail = 0;
          local_8->do_adjoint = 0;
        }
        else {
          arkProcessError((ARKodeMem)0x0,0,0x667,"arkCreate",
                          "/workspace/llm4binary/github/license_c_cmakelists/LLNL[P]sundials/src/arkode/arkode.c"
                          ,"Error setting default solver options");
          ARKodeFree(&local_8->sunctx);
          local_8 = (ARKodeMem)0x0;
        }
      }
    }
  }
  return local_8;
}

Assistant:

ARKodeMem arkCreate(SUNContext sunctx)
{
  int iret;
  ARKodeMem ark_mem;

  if (!sunctx)
  {
    arkProcessError(NULL, ARK_ILL_INPUT, __LINE__, __func__, __FILE__,
                    MSG_ARK_NULL_SUNCTX);
    return (NULL);
  }

  ark_mem = NULL;
  ark_mem = (ARKodeMem)malloc(sizeof(struct ARKodeMemRec));
  if (ark_mem == NULL)
  {
    arkProcessError(NULL, ARK_MEM_FAIL, __LINE__, __func__, __FILE__,
                    MSG_ARK_ARKMEM_FAIL);
    return (NULL);
  }

  /* Zero out ark_mem */
  memset(ark_mem, 0, sizeof(struct ARKodeMemRec));

  /* Set the context */
  ark_mem->sunctx = sunctx;

  /* Set uround */
  ark_mem->uround = SUN_UNIT_ROUNDOFF;

  /* Initialize time step module to NULL */
  ark_mem->step_attachlinsol              = NULL;
  ark_mem->step_attachmasssol             = NULL;
  ark_mem->step_disablelsetup             = NULL;
  ark_mem->step_disablemsetup             = NULL;
  ark_mem->step_getlinmem                 = NULL;
  ark_mem->step_getmassmem                = NULL;
  ark_mem->step_getimplicitrhs            = NULL;
  ark_mem->step_mmult                     = NULL;
  ark_mem->step_getgammas                 = NULL;
  ark_mem->step_init                      = NULL;
  ark_mem->step_fullrhs                   = NULL;
  ark_mem->step                           = NULL;
  ark_mem->step_setuserdata               = NULL;
  ark_mem->step_printallstats             = NULL;
  ark_mem->step_writeparameters           = NULL;
  ark_mem->step_resize                    = NULL;
  ark_mem->step_reset                     = NULL;
  ark_mem->step_free                      = NULL;
  ark_mem->step_printmem                  = NULL;
  ark_mem->step_setdefaults               = NULL;
  ark_mem->step_computestate              = NULL;
  ark_mem->step_setrelaxfn                = NULL;
  ark_mem->step_setorder                  = NULL;
  ark_mem->step_setnonlinearsolver        = NULL;
  ark_mem->step_setlinear                 = NULL;
  ark_mem->step_setnonlinear              = NULL;
  ark_mem->step_setautonomous             = NULL;
  ark_mem->step_setnlsrhsfn               = NULL;
  ark_mem->step_setdeduceimplicitrhs      = NULL;
  ark_mem->step_setnonlincrdown           = NULL;
  ark_mem->step_setnonlinrdiv             = NULL;
  ark_mem->step_setdeltagammamax          = NULL;
  ark_mem->step_setlsetupfrequency        = NULL;
  ark_mem->step_setpredictormethod        = NULL;
  ark_mem->step_setmaxnonliniters         = NULL;
  ark_mem->step_setnonlinconvcoef         = NULL;
  ark_mem->step_setstagepredictfn         = NULL;
  ark_mem->step_getnumrhsevals            = NULL;
  ark_mem->step_setstepdirection          = NULL;
  ark_mem->step_getnumlinsolvsetups       = NULL;
  ark_mem->step_setadaptcontroller        = NULL;
  ark_mem->step_getestlocalerrors         = NULL;
  ark_mem->step_getcurrentgamma           = NULL;
  ark_mem->step_getnonlinearsystemdata    = NULL;
  ark_mem->step_getnumnonlinsolviters     = NULL;
  ark_mem->step_getnumnonlinsolvconvfails = NULL;
  ark_mem->step_getnonlinsolvstats        = NULL;
  ark_mem->step_setforcing                = NULL;
  ark_mem->step_mem                       = NULL;
  ark_mem->step_supports_adaptive         = SUNFALSE;
  ark_mem->step_supports_implicit         = SUNFALSE;
  ark_mem->step_supports_massmatrix       = SUNFALSE;
  ark_mem->step_supports_relaxation       = SUNFALSE;

  /* Initialize root finding variables */
  ark_mem->root_mem = NULL;

  /* Initialize inequality constraints variables */
  ark_mem->constraintsSet = SUNFALSE;
  ark_mem->constraints    = NULL;

  /* Initialize relaxation variables */
  ark_mem->relax_enabled = SUNFALSE;
  ark_mem->relax_mem     = NULL;

  /* Initialize lrw and liw */
  ark_mem->lrw = 18;
  ark_mem->liw = 53; /* fcn/data ptr, int, long int, sunindextype, sunbooleantype */

  /* No mallocs have been done yet */
  ark_mem->VabstolMallocDone  = SUNFALSE;
  ark_mem->VRabstolMallocDone = SUNFALSE;
  ark_mem->MallocDone         = SUNFALSE;

  /* No user-supplied step postprocessing function yet */
  ark_mem->ProcessStep = NULL;
  ark_mem->ps_data     = NULL;

  /* No user-supplied stage postprocessing function yet */
  ark_mem->ProcessStage = NULL;

  /* No user_data pointer yet */
  ark_mem->user_data = NULL;

  /* Allocate step adaptivity structure and note storage */
  ark_mem->hadapt_mem = arkAdaptInit();
  if (ark_mem->hadapt_mem == NULL)
  {
    arkProcessError(NULL, ARK_MEM_FAIL, __LINE__, __func__, __FILE__,
                    "Allocation of step adaptivity structure failed");
    ARKodeFree((void**)&ark_mem);
    return (NULL);
  }
  ark_mem->lrw += ARK_ADAPT_LRW;
  ark_mem->liw += ARK_ADAPT_LIW;

  /* Initialize the interpolation structure to NULL */
  ark_mem->interp        = NULL;
  ark_mem->interp_type   = ARK_INTERP_HERMITE;
  ark_mem->interp_degree = ARK_INTERP_MAX_DEGREE;

  /* Initially, rwt should point to ewt */
  ark_mem->rwt_is_ewt = SUNTRUE;

  /* Indicate that calling the full RHS function is not required, this flag is
     updated to SUNTRUE by the interpolation module initialization function
     and/or the stepper initialization function in arkInitialSetup */
  ark_mem->call_fullrhs = SUNFALSE;

  /* Indicate that the problem needs to be initialized */
  ark_mem->initsetup   = SUNTRUE;
  ark_mem->init_type   = FIRST_INIT;
  ark_mem->firststage  = SUNTRUE;
  ark_mem->initialized = SUNFALSE;

  /* Initial step size has not been determined yet */
  ark_mem->h   = ZERO;
  ark_mem->h0u = ZERO;

  /* Accumulated error estimation strategy */
  ark_mem->AccumErrorType = ARK_ACCUMERROR_NONE;
  ark_mem->AccumError     = ZERO;

  /* Set default values for integrator and stepper optional inputs */
  iret = ARKodeSetDefaults(ark_mem);
  if (iret != ARK_SUCCESS)
  {
    arkProcessError(NULL, 0, __LINE__, __func__, __FILE__,
                    "Error setting default solver options");
    ARKodeFree((void**)&ark_mem);
    return (NULL);
  }

  ark_mem->load_checkpoint_fail = SUNFALSE;
  ark_mem->do_adjoint           = SUNFALSE;

  /* Return pointer to ARKODE memory block */
  return (ark_mem);
}